

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_oram_opt.h
# Opt level: O1

int __thiscall CircuitOramOpt::access(CircuitOramOpt *this,char *__name,int __type)

{
  uniform_int_distribution<int> *__param;
  int iVar1;
  bool bVar2;
  result_type rVar3;
  int iVar4;
  undefined7 extraout_var;
  int iVar5;
  int path;
  uint uVar6;
  
  iVar4 = (int)__name;
  bVar2 = TreeOram::readAndRemove((TreeOram *)this,iVar4);
  Bucket<int>::add((this->super_CircuitOram).super_TreeOram.stash,iVar4);
  __param = &(this->super_CircuitOram).super_TreeOram.uni;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (__param,&(this->super_CircuitOram).super_TreeOram.rg,&__param->_M_param);
  (this->super_CircuitOram).super_TreeOram.index.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[iVar4] = rVar3;
  iVar4 = this->cnt2 + 1;
  this->cnt2 = iVar4;
  if ((iVar4 == this->naccess) && (this->cnt2 = 0, 0 < this->nevict)) {
    iVar4 = 0;
    do {
      iVar1 = (this->super_CircuitOram).super_TreeOram.h;
      path = 0;
      if (1 < iVar1) {
        iVar5 = iVar1 + -1;
        path = 0;
        uVar6 = this->cnt;
        do {
          path = (uVar6 & 1) + path * 2;
          uVar6 = (int)uVar6 >> 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      this->cnt = (int)(this->cnt + 1U) % (1 << ((char)iVar1 - 1U & 0x1f));
      CircuitOram::flush(&this->super_CircuitOram,path);
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->nevict);
  }
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool access(int identifier)
      {
         bool res = readAndRemove(identifier);
         stash->add(identifier);
         update_pos(identifier);
         cnt2++;
         if(cnt2 == naccess) {
            cnt2 = 0;
            for(int i = 0; i < nevict; ++i) {
               flush(reverse_order());
            }
         }
         return res;
      }